

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

node_t * __thiscall
expression_tree::node<int,_expression_tree::no_caching,_expression_tree::sequential>::operator=
          (node<int,_expression_tree::no_caching,_expression_tree::sequential> *this,
          function<int_()> *f)

{
  leaf<int_(*)()> *this_00;
  function<int_()> local_38;
  function<int_()> *local_18;
  function<int_()> *f_local;
  node<int,_expression_tree::no_caching,_expression_tree::sequential> *this_local;
  
  local_18 = f;
  f_local = (function<int_()> *)this;
  this_00 = (leaf<int_(*)()> *)operator_new(0x28);
  std::function<int_()>::function(&local_38,local_18);
  detail::leaf<int_(*)()>::leaf(this_00,&local_38);
  std::
  unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  ::reset(&this->impl,(pointer)this_00);
  std::function<int_()>::~function(&local_38);
  if (this->parent != (node_t *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const std::function<T ()>& f)
	{
		impl.reset(new detail::leaf<T (*)()>(f));
		
		if(parent)
		{
			parent->modified();
		}
		
		return *this;
	}